

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O2

REF_STATUS ref_cell_remove(REF_CELL ref_cell,REF_INT cell)

{
  REF_INT *pRVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = 3;
  if (((-1 < cell) && (cell < ref_cell->max)) &&
     (lVar4 = (long)cell, ref_cell->c2n[ref_cell->size_per * lVar4] != -1)) {
    ref_cell->n = ref_cell->n + -1;
    lVar3 = 0;
    do {
      if (ref_cell->node_per <= (int)lVar3) {
        pRVar1 = ref_cell->c2n;
        pRVar1[ref_cell->size_per * lVar4] = -1;
        pRVar1[ref_cell->size_per * lVar4 + 1] = ref_cell->blank;
        ref_cell->blank = cell;
        return 0;
      }
      uVar2 = ref_adj_remove(ref_cell->ref_adj,ref_cell->c2n[ref_cell->size_per * lVar4 + lVar3],
                             cell);
      lVar3 = lVar3 + 1;
    } while (uVar2 == 0);
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x315,
           "ref_cell_remove",(ulong)uVar2,"unregister cell");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_cell_remove(REF_CELL ref_cell, REF_INT cell) {
  REF_INT node;
  if (!ref_cell_valid(ref_cell, cell)) return REF_INVALID;
  ref_cell_n(ref_cell)--;

  for (node = 0; node < ref_cell_node_per(ref_cell); node++)
    RSS(ref_adj_remove(ref_cell->ref_adj, ref_cell_c2n(ref_cell, node, cell),
                       cell),
        "unregister cell");

  ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
  ref_cell_c2n(ref_cell, 1, cell) = ref_cell_blank(ref_cell);
  ref_cell_blank(ref_cell) = cell;

  return REF_SUCCESS;
}